

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::setTranslation<float>(Matrix33<float> *this,Vec2<float> *t)

{
  Vec2<float> *t_local;
  Matrix33<float> *this_local;
  
  this->x[0][0] = 1.0;
  this->x[0][1] = 0.0;
  this->x[0][2] = 0.0;
  this->x[1][0] = 0.0;
  this->x[1][1] = 1.0;
  this->x[1][2] = 0.0;
  this->x[2][0] = t->x;
  this->x[2][1] = t->y;
  this->x[2][2] = 1.0;
  return this;
}

Assistant:

const Matrix33<T>&
                 Matrix33<T>::setTranslation (const Vec2<S>& t) IMATH_NOEXCEPT
{
    x[0][0] = 1;
    x[0][1] = 0;
    x[0][2] = 0;

    x[1][0] = 0;
    x[1][1] = 1;
    x[1][2] = 0;

    x[2][0] = t.x;
    x[2][1] = t.y;
    x[2][2] = 1;

    return *this;
}